

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign
          (CImgDisplay *this,uint dimw,uint dimh,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  void *__s;
  X11_info *pXVar1;
  long lVar2;
  CImgDisplay *pCVar3;
  
  if (dimw != 0 && dimh != 0) {
    _assign(this,dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
    this->_min = 0.0;
    this->_max = 0.0;
    __s = this->_data;
    pXVar1 = cimg::X11_attr();
    if (pXVar1->nb_bits == 8) {
      lVar2 = 1;
    }
    else {
      pXVar1 = cimg::X11_attr();
      lVar2 = (ulong)(pXVar1->nb_bits != 0x10) * 2 + 2;
    }
    memset(__s,0,(ulong)this->_height * (ulong)this->_width * lVar2);
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  pCVar3 = assign(this);
  return pCVar3;
}

Assistant:

CImgDisplay& assign(const unsigned int dimw, const unsigned int dimh, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!dimw || !dimh) return assign();
      _assign(dimw,dimh,title,normalization_type,fullscreen_flag,closed_flag);
      _min = _max = 0;
      std::memset(_data,0,(cimg::X11_attr().nb_bits==8?sizeof(unsigned char):
                          (cimg::X11_attr().nb_bits==16?sizeof(unsigned short):sizeof(unsigned int)))*_width*_height);
      return paint();
    }